

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  void *__dest;
  GLboolean GVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  long lVar5;
  uint uVar6;
  DILogger local_e10;
  DILogger local_c90;
  DILogger local_b10;
  allocator<unsigned_int> local_98d;
  value_type_conflict4 local_98c;
  undefined1 local_988 [8];
  CDataArray dataTest;
  DILogger local_7f0;
  DILogger local_670;
  DILogger local_4f0;
  void *local_370;
  void *buf;
  int local_1e8;
  int local_1e4;
  int quarterSize;
  int halfSize;
  CDataArray dataRef2;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  undefined1 local_198 [8];
  DIResult result;
  CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  result.status_ = (long)this;
  DIResult::DIResult((DIResult *)local_198);
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,this->_buffer);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DrawIndirectBase::getDataSize
            (&this->super_DrawIndirectBase,
             (int *)((long)&dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,
             dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,1,1000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quarterSize);
  DrawIndirectBase::DataGen<unsigned_int>
            (&this->super_DrawIndirectBase,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quarterSize,
             dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,1000,2000);
  local_1e4 = ((int)(uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage / 2) *
              dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
  uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  if ((int)(uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0) {
    uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 3;
  }
  local_1e8 = ((int)uVar6 >> 2) *
              dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_;
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x8f3f,sVar3 << 2,pvVar4,0x88e8);
  lVar5 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result((DILogger *)&buf,(DIResult *)local_198,lVar5);
  DILogger::~DILogger((DILogger *)&buf);
  local_370 = glu::CallLogWrapper::glMapBufferRange
                        (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper,0x8f3f,(long)local_1e8 << 2,(long)local_1e4 << 2,0x12
                        );
  if (local_370 == (void *)0x0) {
    DIResult::error(&local_4f0,(DIResult *)local_198);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_4f0,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    DILogger::~DILogger(&local_4f0);
  }
  if (local_370 != (void *)0x0) {
    lVar5 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,0x12,(long)local_1e8 << 2,
                       (long)local_1e4 << 2);
    DIResult::sub_result(&local_670,(DIResult *)local_198,lVar5);
    DILogger::~DILogger(&local_670);
    __dest = local_370;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quarterSize,
                        (long)local_1e8);
    memcpy(__dest,pvVar4,(long)local_1e4 << 2);
    glu::CallLogWrapper::glFlushMappedBufferRange
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8f3f,0,(long)local_1e4 << 2);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer
                      (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper,0x8f3f);
    if (GVar1 == '\0') {
      DIResult::error(&local_7f0,(DIResult *)local_198);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_7f0,
                 (char (*) [75])
                 "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE");
      DILogger::~DILogger(&local_7f0);
    }
    local_370 = (void *)0x0;
    lVar5 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result
              ((DILogger *)
               &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(DIResult *)local_198,lVar5);
    DILogger::~DILogger((DILogger *)
                        &dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  iVar2 = dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ *
          (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  local_98c = 0;
  std::allocator<unsigned_int>::allocator(&local_98d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988,(long)iVar2,&local_98c
             ,&local_98d);
  std::allocator<unsigned_int>::~allocator(&local_98d);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988,0);
  DrawIndirectBase::GetBufferSubData<glcts::(anonymous_namespace)::test_api::GL>
            (&this->super_DrawIndirectBase,0x8f3f,0,sVar3 << 2,pvVar4);
  uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  if ((int)(uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0) {
    uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 3;
  }
  lVar5 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)uVar6 >> 2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)uVar6 >> 2,0,0);
  DIResult::sub_result(&local_b10,(DIResult *)local_198,lVar5);
  DILogger::~DILogger(&local_b10);
  uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  if ((int)(uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0) {
    uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 3;
  }
  lVar5 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quarterSize,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (int)(uint)dataRef2.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage / 2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                     (int)(uint)dataRef2.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage / 2,
                     (int)uVar6 >> 2,(int)uVar6 >> 2);
  DIResult::sub_result(&local_c90,(DIResult *)local_198,lVar5);
  DILogger::~DILogger(&local_c90);
  uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  if ((int)(uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage < 0) {
    uVar6 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 3;
  }
  iVar2 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage * 3;
  if ((int)((uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * 3) < 0) {
    iVar2 = (uint)dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage * 3 + 3;
  }
  lVar5 = DrawIndirectBase::DataCompare<unsigned_int>
                    (&this->super_DrawIndirectBase,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)uVar6 >> 2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988,
                     dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,(int)uVar6 >> 2,
                     iVar2 >> 2,iVar2 >> 2);
  DIResult::sub_result(&local_e10,(DIResult *)local_198,lVar5);
  DILogger::~DILogger(&local_e10);
  lVar5 = DIResult::code((DIResult *)local_198);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_988);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&quarterSize);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&dataHeight);
  DIResult::~DIResult((DIResult *)local_198);
  return lVar5;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 1, 1000);

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 1000, 2000);

		const int halfSize	= dataHeight / 2 * dataWidth;
		const int quarterSize = dataHeight / 4 * dataWidth;

		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, quarterSize * sizeof(unsigned int),
									 halfSize * sizeof(unsigned int), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT,
												 quarterSize * sizeof(unsigned int), halfSize * sizeof(unsigned int)));

			memcpy(buf, &dataRef2[quarterSize], halfSize * sizeof(unsigned int));
			glFlushMappedBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, halfSize * sizeof(unsigned int));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		CDataArray dataTest(dataWidth * dataHeight, 0);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4));

		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight / 2, dataTest, dataWidth, dataHeight / 2,
									  dataHeight / 4, dataHeight / 4));

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4,
									  dataHeight * 3 / 4, dataHeight * 3 / 4));

		return result.code();
	}